

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall kj::_::BTreeImpl::move(BTreeImpl *this,Leaf *dst,uint dstPos,Leaf *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  
  uVar7 = src->next;
  uVar8 = src->prev;
  uVar1 = *(undefined8 *)src->rows;
  uVar2 = *(undefined8 *)(src->rows + 2);
  uVar3 = *(undefined8 *)(src->rows + 4);
  uVar4 = *(undefined8 *)(src->rows + 6);
  uVar5 = *(undefined8 *)(src->rows + 8);
  uVar6 = *(undefined8 *)(src->rows + 0xc);
  *(undefined8 *)(dst->rows + 10) = *(undefined8 *)(src->rows + 10);
  *(undefined8 *)(dst->rows + 0xc) = uVar6;
  *(undefined8 *)(dst->rows + 6) = uVar4;
  *(undefined8 *)(dst->rows + 8) = uVar5;
  *(undefined8 *)(dst->rows + 2) = uVar2;
  *(undefined8 *)(dst->rows + 4) = uVar3;
  dst->next = uVar7;
  dst->prev = uVar8;
  *(undefined8 *)dst->rows = uVar1;
  puVar9 = this->tree[src->next].field_0.freelist.zero;
  if ((ulong)src->next == 0) {
    puVar9 = &this->endLeaf;
  }
  *puVar9 = dstPos;
  if ((ulong)src->prev != 0) {
    this->tree[src->prev].field_0.leaf.next = dstPos;
    return;
  }
  this->beginLeaf = dstPos;
  return;
}

Assistant:

void BTreeImpl::move(Leaf& dst, uint dstPos, Leaf& src) {
  dst = src;
  if (src.next == 0) {
    endLeaf = dstPos;
  } else {
    tree[src.next].leaf.prev = dstPos;
  }
  if (src.prev == 0) {
    beginLeaf = dstPos;
  } else {
    tree[src.prev].leaf.next = dstPos;
  }
}